

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::NodeTranslator
          (NodeTranslator *this,Resolver *resolver,ErrorReporter *errorReporter,Reader *decl,
          Orphan<capnp::schema::Node> *wipNodeParam,bool compileAnnotations)

{
  Reader decl_00;
  Builder builder;
  Builder builder_00;
  Reader *params;
  Orphan<capnp::schema::Node> *pOVar1;
  Orphanage OVar2;
  undefined8 in_stack_fffffffffffffe20;
  BuilderFor<capnp::schema::Node> local_140;
  uint64_t local_118;
  SegmentBuilder *pSStack_110;
  CapTableBuilder *local_108;
  word *pwStack_100;
  uint64_t local_f8;
  SegmentBuilder *pSStack_f0;
  Reader local_d0;
  uint local_9c;
  ReaderFor<capnp::schema::Node> local_98;
  uint64_t local_68;
  BuilderFor<capnp::schema::Node> local_60;
  byte local_31;
  Orphan<capnp::schema::Node> *pOStack_30;
  bool compileAnnotations_local;
  Orphan<capnp::schema::Node> *wipNodeParam_local;
  Reader *decl_local;
  ErrorReporter *errorReporter_local;
  Resolver *resolver_local;
  NodeTranslator *this_local;
  
  this->resolver = resolver;
  this->errorReporter = errorReporter;
  local_31 = compileAnnotations;
  pOStack_30 = wipNodeParam;
  wipNodeParam_local = (Orphan<capnp::schema::Node> *)decl;
  decl_local = (Reader *)errorReporter;
  errorReporter_local = (ErrorReporter *)resolver;
  resolver_local = (Resolver *)this;
  Orphan<capnp::schema::Node>::get(&local_60,wipNodeParam);
  builder._builder.capTable = (CapTableBuilder *)local_60._builder.data;
  builder._builder.segment = (SegmentBuilder *)local_60._builder.capTable;
  builder._builder.data = local_60._builder.pointers;
  builder._builder.pointers = (WirePointer *)local_60._builder._32_8_;
  builder._builder.dataSize = (int)in_stack_fffffffffffffe20;
  builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe20 >> 0x30);
  OVar2 = Orphanage::getForMessageContaining<capnp::schema::Node::Builder>(builder);
  params = decl_local;
  this->orphanage = OVar2;
  this->compileAnnotations = (bool)(local_31 & 1);
  Orphan<capnp::schema::Node>::getReader(&local_98,wipNodeParam);
  local_68 = capnp::schema::Node::Reader::getId(&local_98);
  Declaration::Reader::getParameters(&local_d0,(Reader *)wipNodeParam_local);
  local_9c = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                       (&local_d0);
  kj::
  refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long,unsigned_int,capnp::compiler::Resolver&>
            ((kj *)&this->localBrand,(ErrorReporter *)params,&local_68,&local_9c,
             (Resolver *)errorReporter_local);
  pOVar1 = kj::mv<capnp::Orphan<capnp::schema::Node>>(wipNodeParam);
  Orphan<capnp::schema::Node>::Orphan(&this->wipNode,pOVar1);
  Orphanage::newOrphan<capnp::schema::Node::SourceInfo>(&this->sourceInfo,&this->orphanage);
  kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::Vector(&this->groups);
  kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::Vector(&this->paramStructs);
  kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::Vector(&this->unfinishedValues);
  local_118 = (wipNodeParam_local->builder).tag.content;
  pSStack_110 = (wipNodeParam_local->builder).segment;
  local_108 = (wipNodeParam_local->builder).capTable;
  pwStack_100 = (wipNodeParam_local->builder).location;
  local_f8 = wipNodeParam_local[1].builder.tag.content;
  pSStack_f0 = wipNodeParam_local[1].builder.segment;
  Orphan<capnp::schema::Node>::get(&local_140,&this->wipNode);
  decl_00._reader.capTable = (CapTableReader *)pSStack_110;
  decl_00._reader.segment = (SegmentReader *)local_118;
  decl_00._reader.data = local_108;
  decl_00._reader.pointers = (WirePointer *)pwStack_100;
  decl_00._reader.dataSize = (undefined4)local_f8;
  decl_00._reader.pointerCount = local_f8._4_2_;
  decl_00._reader._38_2_ = local_f8._6_2_;
  decl_00._reader._40_8_ = pSStack_f0;
  builder_00._builder.capTable = local_140._builder.capTable;
  builder_00._builder.segment = local_140._builder.segment;
  builder_00._builder.data = local_140._builder.data;
  builder_00._builder.pointers = local_140._builder.pointers;
  builder_00._builder.dataSize = local_140._builder.dataSize;
  builder_00._builder.pointerCount = local_140._builder.pointerCount;
  builder_00._builder._38_2_ = local_140._builder._38_2_;
  compileNode(this,decl_00,builder_00);
  return;
}

Assistant:

NodeTranslator::NodeTranslator(
    Resolver& resolver, ErrorReporter& errorReporter,
    const Declaration::Reader& decl, Orphan<schema::Node> wipNodeParam,
    bool compileAnnotations)
    : resolver(resolver), errorReporter(errorReporter),
      orphanage(Orphanage::getForMessageContaining(wipNodeParam.get())),
      compileAnnotations(compileAnnotations),
      localBrand(kj::refcounted<BrandScope>(
          errorReporter, wipNodeParam.getReader().getId(),
          decl.getParameters().size(), resolver)),
      wipNode(kj::mv(wipNodeParam)),
      sourceInfo(orphanage.newOrphan<schema::Node::SourceInfo>()) {
  compileNode(decl, wipNode.get());
}